

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O1

void do_mirror_data<unsigned_long_long>
               (QImageData *dst,QImageData *src,int dstX0,int dstY0,int dstXIncr,int dstYIncr,int w,
               int h)

{
  uchar *puVar1;
  uchar *puVar2;
  undefined8 uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  int srcY;
  int srcXEnd2;
  
  if (dst == src) {
    uVar4 = h;
    uVar7 = w / 2;
    if (dstY0 != 0) {
      uVar4 = h / 2;
      uVar7 = w;
    }
    if (dstX0 == 0) {
      uVar7 = w;
    }
    if (0 < (int)uVar4) {
      puVar1 = src->data;
      lVar5 = (long)dstY0;
      puVar2 = dst->data;
      uVar10 = 0;
      do {
        if (0 < (int)uVar7) {
          puVar8 = puVar2 + dst->bytes_per_line * lVar5 + (long)dstX0 * 8;
          lVar6 = src->bytes_per_line * uVar10;
          uVar9 = 0;
          do {
            uVar3 = *(undefined8 *)(puVar1 + uVar9 * 8 + lVar6);
            *(undefined8 *)(puVar1 + uVar9 * 8 + lVar6) = *(undefined8 *)puVar8;
            *(undefined8 *)puVar8 = uVar3;
            uVar9 = uVar9 + 1;
            puVar8 = puVar8 + (long)dstXIncr * 8;
          } while (uVar7 != uVar9);
        }
        uVar10 = uVar10 + 1;
        lVar5 = lVar5 + dstYIncr;
      } while (uVar10 != uVar4);
    }
    if ((((dstY0 != 0) && (dstX0 != 0)) && ((h & 1U) != 0)) && (1 < w)) {
      lVar5 = (long)(h / 2) * src->bytes_per_line;
      puVar1 = src->data;
      lVar6 = (long)dstX0;
      uVar10 = 0;
      do {
        uVar3 = *(undefined8 *)(puVar1 + uVar10 * 8 + lVar5);
        *(undefined8 *)(puVar1 + uVar10 * 8 + lVar5) = *(undefined8 *)(puVar1 + lVar6 * 8 + lVar5);
        *(undefined8 *)(puVar1 + lVar6 * 8 + lVar5) = uVar3;
        uVar10 = uVar10 + 1;
        lVar6 = lVar6 + dstXIncr;
      } while ((uint)(w / 2) != uVar10);
    }
  }
  else if (0 < h) {
    puVar1 = src->data;
    lVar5 = (long)dstY0;
    puVar2 = dst->data;
    uVar10 = 0;
    do {
      if (0 < w) {
        lVar6 = src->bytes_per_line;
        puVar8 = puVar2 + dst->bytes_per_line * lVar5 + (long)dstX0 * 8;
        uVar9 = 0;
        do {
          *(undefined8 *)puVar8 = *(undefined8 *)(puVar1 + uVar9 * 8 + lVar6 * uVar10);
          uVar9 = uVar9 + 1;
          puVar8 = puVar8 + (long)dstXIncr * 8;
        } while ((uint)w != uVar9);
      }
      uVar10 = uVar10 + 1;
      lVar5 = lVar5 + dstYIncr;
    } while (uVar10 != (uint)h);
  }
  return;
}

Assistant:

inline void do_mirror_data(QImageData *dst, QImageData *src,
                                             int dstX0, int dstY0,
                                             int dstXIncr, int dstYIncr,
                                             int w, int h)
{
    if (dst == src) {
        // When mirroring in-place, stop in the middle for one of the directions, since we
        // are swapping the bytes instead of merely copying.
        const int srcXEnd = (dstX0 && !dstY0) ? w / 2 : w;
        const int srcYEnd = dstY0 ? h / 2 : h;
        for (int srcY = 0, dstY = dstY0; srcY < srcYEnd; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], dstPtr[dstX]);
        }
        // If mirroring both ways, the middle line needs to be mirrored horizontally only.
        if (dstX0 && dstY0 && (h & 1)) {
            int srcY = h / 2;
            int srcXEnd2 = w / 2;
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd2; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], srcPtr[dstX]);
        }
    } else {
        for (int srcY = 0, dstY = dstY0; srcY < h; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < w; ++srcX, dstX += dstXIncr)
                dstPtr[dstX] = srcPtr[srcX];
        }
    }
}